

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::anon_unknown_0::recursive_copy_skip(xml_node *dest,xml_node *source,xml_node *skip)

{
  xml_node_struct *pxVar1;
  xml_attribute xVar2;
  uint uVar3;
  char *rhs;
  char_t *pcVar4;
  xml_attribute_struct *pxVar5;
  xml_node cc;
  xml_node local_38;
  xml_node local_30;
  
  pxVar1 = source->_root;
  if (dest->_root == (xml_node_struct *)0x0) {
    if (pxVar1 == (xml_node_struct *)0x0) {
switchD_00114a87_caseD_0:
      __assert_fail("!\"Invalid node type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                    ,0xccf,
                    "void pugi::impl::(anonymous namespace)::recursive_copy_skip(xml_node &, const xml_node &, const xml_node &)"
                   );
    }
LAB_00114c5b:
    __assert_fail("dest.type() == source.type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0xca0,
                  "void pugi::impl::(anonymous namespace)::recursive_copy_skip(xml_node &, const xml_node &, const xml_node &)"
                 );
  }
  if ((pxVar1 == (xml_node_struct *)0x0) ||
     (uVar3 = (uint)pxVar1->header, (((uint)dest->_root->header ^ uVar3) & 7) != 0))
  goto LAB_00114c5b;
  switch(uVar3 & 7) {
  case 0:
    goto switchD_00114a87_caseD_0;
  case 1:
    pcVar4 = pxVar1->name;
    if (pcVar4 == (char_t *)0x0) {
      pcVar4 = "";
    }
    xml_node::set_name(dest,pcVar4);
    pxVar1 = source->_root;
    if (pxVar1 != (xml_node_struct *)0x0) {
      pxVar5 = pxVar1->first_attribute;
      if (pxVar5 != (xml_attribute_struct *)0x0) {
        do {
          pcVar4 = pxVar5->name;
          if (pcVar4 == (char_t *)0x0) {
            pcVar4 = "";
          }
          xVar2 = xml_node::append_attribute(dest,pcVar4);
          if (xVar2._attr != (xml_attribute_struct *)0x0) {
            pcVar4 = pxVar5->value;
            if (pcVar4 == (char_t *)0x0) {
              pcVar4 = "";
            }
            strcpy_insitu(&(xVar2._attr)->value,&(xVar2._attr)->header,8,pcVar4);
          }
          pxVar5 = pxVar5->next_attribute;
        } while (pxVar5 != (xml_attribute_struct *)0x0);
        pxVar1 = source->_root;
        if (pxVar1 == (xml_node_struct *)0x0) {
          return;
        }
      }
      pxVar1 = pxVar1->first_child;
      if (pxVar1 != (xml_node_struct *)0x0) {
        do {
          if (pxVar1 != skip->_root) {
            local_38._root = pxVar1;
            local_30 = xml_node::append_child(dest,((uint)pxVar1->header & 7) + node_document);
            if (local_30._root == (xml_node_struct *)0x0) {
              __assert_fail("cc",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                            ,0xcb0,
                            "void pugi::impl::(anonymous namespace)::recursive_copy_skip(xml_node &, const xml_node &, const xml_node &)"
                           );
            }
            recursive_copy_skip(&local_30,&local_38,skip);
          }
          pxVar1 = pxVar1->next_sibling;
        } while (pxVar1 != (xml_node_struct *)0x0);
      }
    }
    break;
  default:
    rhs = "";
    if (pxVar1->value != (char_t *)0x0) {
      rhs = pxVar1->value;
    }
    goto LAB_00114a9e;
  case 5:
    pcVar4 = pxVar1->name;
    if (pcVar4 == (char_t *)0x0) {
      pcVar4 = "";
    }
    xml_node::set_name(dest,pcVar4);
    rhs = "";
    if (source->_root != (xml_node_struct *)0x0) {
      pcVar4 = source->_root->value;
      rhs = "";
      if (pcVar4 != (char_t *)0x0) {
        rhs = pcVar4;
      }
    }
LAB_00114a9e:
    xml_node::set_value(dest,rhs);
    return;
  case 6:
    pcVar4 = pxVar1->name;
    if (pcVar4 == (char_t *)0x0) {
      pcVar4 = "";
    }
    xml_node::set_name(dest,pcVar4);
    if (source->_root != (xml_node_struct *)0x0) {
      for (pxVar5 = source->_root->first_attribute; pxVar5 != (xml_attribute_struct *)0x0;
          pxVar5 = pxVar5->next_attribute) {
        pcVar4 = pxVar5->name;
        if (pcVar4 == (char_t *)0x0) {
          pcVar4 = "";
        }
        xVar2 = xml_node::append_attribute(dest,pcVar4);
        if (xVar2._attr != (xml_attribute_struct *)0x0) {
          pcVar4 = pxVar5->value;
          if (pcVar4 == (char_t *)0x0) {
            pcVar4 = "";
          }
          strcpy_insitu(&(xVar2._attr)->value,&(xVar2._attr)->header,8,pcVar4);
        }
      }
    }
  }
  return;
}

Assistant:

PUGI__FN void recursive_copy_skip(xml_node& dest, const xml_node& source, const xml_node& skip)
	{
		assert(dest.type() == source.type());

		switch (source.type())
		{
		case node_element:
		{
			dest.set_name(source.name());

			for (xml_attribute a = source.first_attribute(); a; a = a.next_attribute())
				dest.append_attribute(a.name()).set_value(a.value());

			for (xml_node c = source.first_child(); c; c = c.next_sibling())
			{
				if (c == skip) continue;

				xml_node cc = dest.append_child(c.type());
				assert(cc);

				recursive_copy_skip(cc, c, skip);
			}

			break;
		}

		case node_pcdata:
		case node_cdata:
		case node_comment:
		case node_doctype:
			dest.set_value(source.value());
			break;

		case node_pi:
			dest.set_name(source.name());
			dest.set_value(source.value());
			break;

		case node_declaration:
		{
			dest.set_name(source.name());

			for (xml_attribute a = source.first_attribute(); a; a = a.next_attribute())
				dest.append_attribute(a.name()).set_value(a.value());

			break;
		}

		default:
			assert(!"Invalid node type");
		}
	}